

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

size_t build_query(char *buf,size_t size,uint16_t qtype,char *dn,int edns)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  ushort uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  
  sVar2 = strlen(dn);
  lVar7 = 0x1d;
  if (edns == 0) {
    lVar7 = 0x12;
  }
  uVar6 = lVar7 + sVar2;
  if (uVar6 <= size && buf != (char *)0x0) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[2] = '\x01';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\x01';
    pcVar5 = buf + 0xc;
    while (pcVar3 = strchr(dn,0x2e), pcVar3 != (char *)0x0) {
      sVar2 = (long)pcVar3 - (long)dn;
      *pcVar5 = (char)sVar2;
      memcpy(pcVar5 + 1,dn,sVar2);
      pcVar5 = pcVar5 + sVar2 + 1;
      dn = pcVar3 + 1;
    }
    sVar2 = strlen(dn);
    *pcVar5 = (char)sVar2;
    strcpy(pcVar5 + 1,dn);
    sVar2 = strlen(dn);
    pcVar3 = pcVar5 + sVar2 + 6;
    *(uint16_t *)(pcVar5 + sVar2 + 2) = qtype << 8 | qtype >> 8;
    (pcVar5 + sVar2 + 4)[0] = '\0';
    (pcVar5 + sVar2 + 4)[1] = '\x01';
    if (edns != 0) {
      uVar4 = (*(ushort *)(buf + 10) << 8 | *(ushort *)(buf + 10) >> 8) + 1;
      *(ushort *)(buf + 10) = uVar4 * 0x100 | uVar4 >> 8;
      pcVar1 = pcVar5 + sVar2 + 0xd;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = ')';
      pcVar3[3] = '\x10';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3 = pcVar5 + sVar2 + 0x11;
    }
    if ((long)pcVar3 - (long)buf != uVar6) {
      __assert_fail("p - buf == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/dns.c",
                    0x13b,"size_t build_query(char *, size_t, uint16_t, const char *, int)");
    }
  }
  return uVar6;
}

Assistant:

static size_t build_query(char * buf, size_t size, uint16_t qtype, const char * dn, int edns)
{
    struct dns_header_t * hdr = (struct dns_header_t *)buf;
    size_t rc = sizeof(struct dns_header_t)
                + sizeof(uint16_t) // QTYPE
                + sizeof(uint16_t) // QCLASS
                + strlen(dn) + 2;
    rc += (edns ? sizeof(edns_opt) : 0);

    char * p = buf;
    if (buf && size >= rc) {
        dns_init_query((struct dns_header_t *)p);
        p += sizeof(struct dns_header_t);
        hdr->qdcount = htons(ntohs(hdr->qdcount) + 1);
        for (;;) {
           char * t = strchr(dn, '.');
           if (!t) {
               *p = (char)(strlen(dn));
               p += 1;
               strcpy(p, dn);
               p += strlen(dn) + 1;
               break;
           }
           else {
               *p = (char)(t - dn);
               p += 1;
               memcpy(p, dn, (t - dn));
               p += t - dn;
               dn = t + 1;
           }
        }
        *(uint16_t *)p = htons(qtype);
        p += sizeof(uint16_t);
        *(uint16_t *)p = htons(CLASS_IN);
        p += sizeof(uint16_t);
        // Add EDNS OPT as additional resource if required
        if (edns) {
            hdr->arcount = htons(ntohs(hdr->arcount) + 1);
            memcpy(p, edns_opt, sizeof(edns_opt));
            p += sizeof(edns_opt);
        }
        assert(p - buf == rc);
    }
    return rc;
}